

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parsePrivateProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_1a8;
  PropertyDef local_188;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(&this->super_Parser,LPAREN);
  local_188.constant = true;
  local_188.final = true;
  local_188.required = true;
  local_188._331_1_ = 0xaa;
  local_188.relativeIndex = -0x55555556;
  memset(&local_188,0,0x120);
  local_188.notifyId = -1;
  local_188._316_7_ = 0;
  local_188.revision._3_1_ = 0;
  local_188.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
       (QFlagsStorageHelper<TypeTag,_4>)(QFlagsStorage<TypeTag>)0x0;
  local_188._328_4_ = local_188._328_4_ & 0xff000000;
  local_188.relativeIndex = -1;
  local_188.location = -1;
  parsePropertyAccessor((QByteArray *)&local_1a8,this);
  local_188.inPrivateClass.d.ptr = local_1a8.ptr;
  local_188.inPrivateClass.d.d = local_1a8.d;
  local_1a8.d = (Data *)0x0;
  local_1a8.ptr = (char *)0x0;
  local_188.inPrivateClass.d.size = local_1a8.size;
  local_1a8.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1a8);
  Parser::next(&this->super_Parser,COMMA);
  createPropertyDef(this,&local_188,(int)(def->propertyList).d.size,mode);
  QList<PropertyDef>::emplaceBack<PropertyDef_const&>(&def->propertyList,&local_188);
  PropertyDef::~PropertyDef(&local_188);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parsePrivateProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    propDef.inPrivateClass = parsePropertyAccessor();

    next(COMMA);

    createPropertyDef(propDef, int(def->propertyList.size()), mode);

    def->propertyList += propDef;
}